

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

void __thiscall ktx::CommandCreate::selectASTCMode(CommandCreate *this,uint32_t bitLength)

{
  bool bVar1;
  undefined4 uVar2;
  uint in_ESI;
  long in_RDI;
  char (*in_stack_00000030) [90];
  Reporter *in_stack_00000038;
  
  if (*(int *)(in_RDI + 0x1e8) == 0) {
    uVar2 = 2;
    if (in_ESI < 9) {
      uVar2 = 1;
    }
    *(undefined4 *)(in_RDI + 0x1e8) = uVar2;
  }
  else if ((in_ESI < 9) || (*(int *)(in_RDI + 0x1e8) != 1)) {
    if ((in_ESI < 0x10) && (*(int *)(in_RDI + 0x1e8) == 2)) {
      Reporter::warning<char_const(&)[54]>(in_stack_00000038,(char (*) [54])in_stack_00000030);
    }
  }
  else {
    Reporter::warning<char_const(&)[90]>(in_stack_00000038,in_stack_00000030);
  }
  bVar1 = isFormatSRGB(*(VkFormat *)(in_RDI + 0x4c));
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x4c) = 0x2b;
  }
  else {
    *(undefined4 *)(in_RDI + 0x4c) = 0x25;
  }
  return;
}

Assistant:

void CommandCreate::selectASTCMode(uint32_t bitLength) {
    if (options.mode == KTX_PACK_ASTC_ENCODER_MODE_DEFAULT) {
        // If no astc mode option is specified and if input is <= 8bit
        // default to LDR otherwise default to HDR
        options.mode = bitLength <= 8 ? KTX_PACK_ASTC_ENCODER_MODE_LDR : KTX_PACK_ASTC_ENCODER_MODE_HDR;
    } else {
        if (bitLength > 8 && options.mode == KTX_PACK_ASTC_ENCODER_MODE_LDR)
            // Input is > 8-bit and user wants LDR, issue quality loss warning.
            warning("Input file is 16-bit but ASTC LDR option is specified. Expect quality loss in the output.");
        else if (bitLength < 16 && options.mode == KTX_PACK_ASTC_ENCODER_MODE_HDR)
            // Input is < 16-bit and user wants HDR, issue warning.
            warning("Input file is not 16-bit but HDR option is specified.");
    }

    // ASTC Encoding is performed by first creating a RGBA8 texture then encode it afterward

    // Encode based on non-8-bit input (aka true HDR) is currently not supported by
    // ktxTexture2_CompressAstcEx. Once supported suitable formats can be chosen here
    if (isFormatSRGB(options.vkFormat))
        options.vkFormat = VK_FORMAT_R8G8B8A8_SRGB;
    else
        options.vkFormat = VK_FORMAT_R8G8B8A8_UNORM;
}